

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::ReadOldMocDefinitionsFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory)

{
  bool bVar1;
  char *pcVar2;
  allocator local_71;
  string local_70;
  undefined1 local_40 [8];
  string filename;
  string *targetDirectory_local;
  cmMakefile *makefile_local;
  cmQtAutoGenerators *this_local;
  
  filename.field_2._8_8_ = targetDirectory;
  cmsys::SystemTools::CollapseFullPath((string *)local_40,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  std::__cxx11::string::operator+=((string *)local_40,"/AutomocOldMocDefinitions.cmake");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmMakefile::ReadListFile(makefile,pcVar2);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"AM_OLD_COMPILE_SETTINGS",&local_71);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_70);
    std::__cxx11::string::operator=((string *)&this->OldCompileSettingsStr,pcVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  std::__cxx11::string::~string((string *)local_40);
  return true;
}

Assistant:

bool cmQtAutoGenerators::ReadOldMocDefinitionsFile(cmMakefile* makefile,
                                            const std::string& targetDirectory)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutomocOldMocDefinitions.cmake";

  if (makefile->ReadListFile(filename.c_str()))
    {
    this->OldCompileSettingsStr =
                        makefile->GetSafeDefinition("AM_OLD_COMPILE_SETTINGS");
    }
  return true;
}